

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * __thiscall
QStringBuilder<QStringBuilder<ProString_&,_const_ProString_&>,_ProString_&>::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<ProString_&,_const_ProString_&>,_ProString_&> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ProString *pPVar4;
  char16_t *pcVar5;
  CutResult CVar6;
  char16_t *pcVar7;
  long lVar8;
  char16_t *__dest;
  long in_FS_OFFSET;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar4 = (this->a).a;
  if ((((pPVar4->m_string).d.ptr == (char16_t *)0x0) &&
      ((((this->a).b)->m_string).d.ptr == (char16_t *)0x0)) &&
     ((this->b->m_string).d.ptr == (char16_t *)0x0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00273be8;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    iVar1 = pPVar4->m_length;
    iVar2 = ((this->a).b)->m_length;
    iVar3 = this->b->m_length;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(__return_storage_ptr__,(long)iVar3 + (long)iVar2 + (long)iVar1,Uninitialized);
    __dest = (__return_storage_ptr__->d).ptr;
    pPVar4 = (this->a).a;
    lVar8 = (long)pPVar4->m_length;
    if (lVar8 != 0) {
      pcVar5 = (pPVar4->m_string).d.ptr;
      local_40 = (long)pPVar4->m_offset;
      local_48 = lVar8;
      CVar6 = QtPrivate::QContainerImplHelper::mid((pPVar4->m_string).d.size,&local_40,&local_48);
      pcVar7 = (char16_t *)0x0;
      if (CVar6 != Null) {
        pcVar7 = pcVar5 + local_40;
      }
      memcpy(__dest,pcVar7,lVar8 * 2);
      __dest = __dest + lVar8;
    }
    pPVar4 = (this->a).b;
    lVar8 = (long)pPVar4->m_length;
    if (lVar8 != 0) {
      pcVar5 = (pPVar4->m_string).d.ptr;
      local_40 = (long)pPVar4->m_offset;
      local_48 = lVar8;
      CVar6 = QtPrivate::QContainerImplHelper::mid((pPVar4->m_string).d.size,&local_40,&local_48);
      pcVar7 = (char16_t *)0x0;
      if (CVar6 != Null) {
        pcVar7 = pcVar5 + local_40;
      }
      memcpy(__dest,pcVar7,lVar8 * 2);
      __dest = __dest + lVar8;
    }
    pPVar4 = this->b;
    lVar8 = (long)pPVar4->m_length;
    if (lVar8 != 0) {
      pcVar5 = (pPVar4->m_string).d.ptr;
      local_40 = (long)pPVar4->m_offset;
      local_48 = lVar8;
      CVar6 = QtPrivate::QContainerImplHelper::mid((pPVar4->m_string).d.size,&local_40,&local_48);
      pcVar7 = (char16_t *)0x0;
      if (CVar6 != Null) {
        pcVar7 = pcVar5 + local_40;
      }
      memcpy(__dest,pcVar7,lVar8 * 2);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_00273be8:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }